

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Iterator __thiscall
Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::insert
          (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *this,Item **cell,
          Item *parent,MemberFuncPtr *key,SignalData *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  ItemBlock *pIVar8;
  ulong uVar9;
  Item *pIVar10;
  long lVar11;
  Iterator *pIVar12;
  long lVar13;
  Item *unaff_RBP;
  Item *ptr2;
  
  do {
    if (cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) {
      iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0x188,"!parent || cell == &parent->left || cell == &parent->right");
      if (iVar7 != 0) goto LAB_0010565e;
    }
    ptr2 = *cell;
    if (ptr2 == (Item *)0x0) {
      ptr2 = this->freeItem;
      if (ptr2 == (Item *)0x0) {
        pIVar8 = (ItemBlock *)operator_new__(0x2e8);
        pIVar8->next = this->blocks;
        this->blocks = pIVar8;
        lVar11 = 8;
        lVar13 = 0;
        uVar6 = 0xffffffffffffff50;
        do {
          uVar9 = uVar6;
          *(long *)((long)&pIVar8[0x2d].next + uVar9) = lVar13;
          lVar13 = (long)&pIVar8->next + lVar11;
          lVar11 = lVar11 + 0xb8;
          uVar6 = uVar9 + 0xb8;
        } while (uVar9 + 0xb8 < 0x230);
        ptr2 = (Item *)((long)&pIVar8[0x17].next + uVar9);
        this->freeItem = ptr2;
      }
      uVar4 = *(undefined8 *)&key->field_0x8;
      (ptr2->key).ptr = key->ptr;
      *(undefined8 *)&(ptr2->key).field_0x8 = uVar4;
      (ptr2->value).activation = value->activation;
      List<Callback::Emitter::Slot>::List(&(ptr2->value).slots,&value->slots);
      (ptr2->value).dirty = value->dirty;
      ptr2->parent = parent;
      ptr2->left = (Item *)0x0;
      ptr2->right = (Item *)0x0;
      ptr2->height = 1;
      ptr2->slope = 0;
      this->freeItem = ptr2->prev;
      *cell = ptr2;
      this->_size = this->_size + 1;
      if (parent == (Item *)0x0) {
        if ((this->_begin).item != &this->endItem) {
          iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x1a1,"_begin.item == &endItem");
          if (iVar7 != 0) {
LAB_0010565e:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
        }
        ptr2->prev = (Item *)0x0;
        ptr2->next = (this->_begin).item;
        (this->_begin).item = ptr2;
        (this->endItem).prev = ptr2;
        bVar5 = true;
        parent = (Item *)0x0;
        unaff_RBP = ptr2;
      }
      else {
        pIVar10 = parent;
        if (cell == &parent->right) {
          pIVar10 = parent->next;
        }
        pIVar1 = pIVar10->prev;
        ptr2->prev = pIVar1;
        pIVar12 = &this->_begin;
        if (pIVar1 != (Item *)0x0) {
          pIVar12 = (Iterator *)&pIVar10->prev->next;
        }
        pIVar12->item = ptr2;
        ptr2->next = pIVar10;
        pIVar10->prev = ptr2;
        do {
          uVar2 = parent->height;
          Item::updateHeightAndSlope(parent);
          parent = rebal(this,parent);
          if (uVar2 == parent->height) goto LAB_001055d0;
          parent = parent->parent;
        } while (parent != (Item *)0x0);
        parent = (Item *)0x0;
LAB_001055d0:
        bVar5 = true;
        unaff_RBP = ptr2;
      }
    }
    else {
      iVar7 = Memory::compare(key,ptr2,0x10);
      if (iVar7 < 1) {
        iVar7 = Memory::compare(key,ptr2,0x10);
        if (-1 < iVar7) {
          (ptr2->value).activation = value->activation;
          List<Callback::Emitter::Slot>::operator=(&(ptr2->value).slots,&value->slots);
          (ptr2->value).dirty = value->dirty;
          goto LAB_001055d0;
        }
        cell = &ptr2->left;
      }
      else {
        cell = &ptr2->right;
      }
      bVar5 = false;
      parent = ptr2;
    }
    if (bVar5) {
      return (Iterator)unaff_RBP;
    }
  } while( true );
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }